

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

VarOrConst __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::ExpAId>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>
                 *fc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VarOrConst VVar3;
  BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
  local_70;
  
  paVar2 = &local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
  paVar1 = &(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p ==
      paVar1) {
    local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2 + 8);
    local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar2;
  }
  else {
    local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
       (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_70.constr_.super_FunctionalConstraint.result_var_ =
       (fc->super_FunctionalConstraint).result_var_;
  local_70.constr_.super_FunctionalConstraint.ctx.value_ =
       (fc->super_FunctionalConstraint).ctx.value_;
  local_70.constr_.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::ExpAId>.args_.
  _M_elems[0] = (fc->
                super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::ExpAId>
                ).args_._M_elems[0];
  local_70.constr_.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::ExpAId>._4_4_ =
       *(undefined4 *)
        &(fc->super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::ExpAId>)
         .field_0x4;
  local_70.constr_.
  super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::ExpAId>.params_.
  _M_elems[0] = (_Type)(fc->
                       super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::ExpAId>
                       ).params_._M_elems[0];
  local_70.prepro_.lb_ = -INFINITY;
  local_70.prepro_.ub_ = INFINITY;
  local_70.prepro_.type_ = CONTINUOUS;
  local_70.prepro_.result_var_ = -1;
  local_70.converter_ =
       (FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)this;
  VVar3 = BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
          ::Convert(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      paVar2) {
    operator_delete(local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.
                    _M_dataplus._M_p,
                    local_70.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  VVar3._4_4_ = 0;
  return VVar3;
}

Assistant:

void RedefineVariable(int res_var, FuncConstraint&& fc) {
    assert( MPD( HasInitExpression(res_var) ) );
		auto ci_old = MPD( GetInitExpression(res_var) );
    fc.SetResultVar(res_var);
		// If this expression exists, use it.
		// TODO make sure any new context is re-converted
		// if necessary.
		auto i = MPD( MapFind(fc) );
    // TODO preprocess, try map again, and use the result.
		if (i<0)
      i = int( MPD( AddConstraint(std::move(fc)) ) );
		auto& ck = GET_CONSTRAINT_KEEPER( FuncConstraint );
    ConInfo ci{&ck, i};
    ReplaceInitExpression(res_var, ci);
    MarkAsBridged(ci_old);
  }